

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextEndFrame(ImGuiContext *ctx)

{
  float fVar1;
  void *pvVar2;
  ImDrawFlags flags;
  ImGuiStoragePair *pIVar3;
  int n;
  int i;
  ImRect bg_rect;
  ImRect local_50;
  ImRect local_40;
  
  for (i = 0; i < (ctx->DockContext).Nodes.Data.Size; i = i + 1) {
    pIVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                       ((ImVector<ImGuiStorage::ImGuiStoragePair> *)&ctx->DockContext,i);
    pvVar2 = (pIVar3->field_1).val_p;
    if ((((pvVar2 != (void *)0x0) && (*(int *)((long)pvVar2 + 0xb0) == ctx->FrameCount)) &&
        ((*(uint *)((long)pvVar2 + 0xc4) >> 9 & 1) != 0)) &&
       (((*(ImGuiWindow **)((long)pvVar2 + 0x88) != (ImGuiWindow *)0x0 &&
         ((*(uint *)((long)pvVar2 + 0xc4) >> 0xb & 1) == 0)) &&
        (*(long *)((long)pvVar2 + 0x20) == 0)))) {
      fVar1 = (GImGui->Style).FramePadding.y;
      local_50.Max.x = (float)*(undefined8 *)((long)pvVar2 + 0x48);
      local_50.Max.y = (float)((ulong)*(undefined8 *)((long)pvVar2 + 0x48) >> 0x20);
      local_50.Min.x = local_50.Max.x + 0.0;
      local_50.Min.y = fVar1 + fVar1 + GImGui->FontSize + local_50.Max.y;
      local_50.Max.x = (float)*(undefined8 *)((long)pvVar2 + 0x50) + local_50.Max.x;
      local_50.Max.y = (float)((ulong)*(undefined8 *)((long)pvVar2 + 0x50) >> 0x20) + local_50.Max.y
      ;
      local_40 = ImGuiWindow::Rect(*(ImGuiWindow **)((long)pvVar2 + 0x88));
      flags = CalcRoundingFlagsForRectInRect(&local_50,&local_40,2.0);
      ImDrawList::ChannelsSetCurrent(*(ImDrawList **)(*(long *)((long)pvVar2 + 0x88) + 0x2b8),0);
      ImDrawList::AddRectFilled
                (*(ImDrawList **)(*(long *)((long)pvVar2 + 0x88) + 0x2b8),&local_50.Min,
                 &local_50.Max,*(ImU32 *)((long)pvVar2 + 0x80),
                 *(float *)(*(long *)((long)pvVar2 + 0x88) + 0x80),flags);
    }
  }
  return;
}

Assistant:

void ImGui::DockContextEndFrame(ImGuiContext* ctx)
{
    // Draw backgrounds of node missing their window
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc = &g.DockContext;
    for (int n = 0; n < dc->Nodes.Data.Size; n++)
        if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
            if (node->LastFrameActive == g.FrameCount && node->IsVisible && node->HostWindow && node->IsLeafNode() && !node->IsBgDrawnThisFrame)
            {
                ImRect bg_rect(node->Pos + ImVec2(0.0f, GetFrameHeight()), node->Pos + node->Size);
                ImDrawFlags bg_rounding_flags = CalcRoundingFlagsForRectInRect(bg_rect, node->HostWindow->Rect(), DOCKING_SPLITTER_SIZE);
                node->HostWindow->DrawList->ChannelsSetCurrent(0);
                node->HostWindow->DrawList->AddRectFilled(bg_rect.Min, bg_rect.Max, node->LastBgColor, node->HostWindow->WindowRounding, bg_rounding_flags);
            }
}